

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_hmac.c
# Opt level: O3

err_t beltHMAC(octet *mac,void *src,size_t count,octet *key,size_t len)

{
  bool_t bVar1;
  size_t sVar2;
  blob_t state;
  err_t eVar3;
  belt_hmac_st *st;
  
  bVar1 = memIsValid(src,count);
  eVar3 = 0x6d;
  if (bVar1 != 0) {
    bVar1 = memIsValid(key,len);
    if (bVar1 != 0) {
      bVar1 = memIsValid(mac,0x20);
      if (bVar1 != 0) {
        eVar3 = 0;
        sVar2 = beltCompr_deep();
        state = blobCreate(sVar2 + 0xf8);
        if (state == (blob_t)0x0) {
          eVar3 = 0x6e;
        }
        else {
          beltHMACStart(state,key,len);
          beltHMACStepA(src,count,state);
          beltHMACStepG_internal(state);
          u32To(mac,0x20,(u32 *)((long)state + 0xa0));
          blobClose(state);
        }
      }
    }
  }
  return eVar3;
}

Assistant:

err_t beltHMAC(octet mac[32], const void* src, size_t count,
	const octet key[], size_t len)
{
	void* state;
	// проверить входные данные
	if (!memIsValid(src, count) ||
		!memIsValid(key, len) ||
		!memIsValid(mac, 32))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(beltHMAC_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// выработать имитовставку
	beltHMACStart(state, key, len);
	beltHMACStepA(src, count, state);
	beltHMACStepG(mac, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}